

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_internal.h
# Opt level: O0

VerifySignatureResponseStruct * __thiscall
cfd::js::api::
ExecuteStructApi<cfd::js::api::VerifyEcdsaAdaptorRequestStruct,cfd::js::api::VerifySignatureResponseStruct>
          (VerifySignatureResponseStruct *__return_storage_ptr__,api *this,
          VerifyEcdsaAdaptorRequestStruct *request,
          function<cfd::js::api::VerifySignatureResponseStruct_(const_cfd::js::api::VerifyEcdsaAdaptorRequestStruct_&)>
          *call_function,string *fuction_name)

{
  CfdException *cfde;
  exception *except;
  VerifySignatureResponseStruct local_f0;
  undefined1 local_29;
  function<cfd::js::api::VerifySignatureResponseStruct_(const_cfd::js::api::VerifyEcdsaAdaptorRequestStruct_&)>
  *local_28;
  string *fuction_name_local;
  function<cfd::js::api::VerifySignatureResponseStruct_(const_cfd::js::api::VerifyEcdsaAdaptorRequestStruct_&)>
  *call_function_local;
  VerifyEcdsaAdaptorRequestStruct *request_local;
  VerifySignatureResponseStruct *response;
  
  local_29 = 0;
  local_28 = call_function;
  fuction_name_local = &request->adaptor_signature;
  call_function_local =
       (function<cfd::js::api::VerifySignatureResponseStruct_(const_cfd::js::api::VerifyEcdsaAdaptorRequestStruct_&)>
        *)this;
  request_local = (VerifyEcdsaAdaptorRequestStruct *)__return_storage_ptr__;
  VerifySignatureResponseStruct::VerifySignatureResponseStruct(__return_storage_ptr__);
  cfd::Initialize();
  std::
  function<cfd::js::api::VerifySignatureResponseStruct_(const_cfd::js::api::VerifyEcdsaAdaptorRequestStruct_&)>
  ::operator()(&local_f0,
               (function<cfd::js::api::VerifySignatureResponseStruct_(const_cfd::js::api::VerifyEcdsaAdaptorRequestStruct_&)>
                *)request,(VerifyEcdsaAdaptorRequestStruct *)call_function_local);
  VerifySignatureResponseStruct::operator=(__return_storage_ptr__,&local_f0);
  VerifySignatureResponseStruct::~VerifySignatureResponseStruct(&local_f0);
  return __return_storage_ptr__;
}

Assistant:

ResponseStructType ExecuteStructApi(
    const RequestStructType& request,
    std::function<ResponseStructType(const RequestStructType&)> call_function,
    std::string fuction_name) {
  ResponseStructType response;
  try {
    cfd::Initialize();

    response = call_function(request);
  } catch (const CfdException& cfde) {
    warn(
        CFD_LOG_SOURCE,
        "Failed to {}. CfdException occurred:  code={}, message={}",
        fuction_name, cfde.GetErrorCode(), cfde.what());
    response.error = cfd::js::api::ConvertCfdExceptionToStruct(cfde);
  } catch (const std::exception& except) {
    warn(
        CFD_LOG_SOURCE, "Failed to {}. Exception occurred: message={}",
        fuction_name, except.what());
    response.error = cfd::js::api::ConvertCfdExceptionToStruct(CfdException());
  } catch (...) {
    warn(
        CFD_LOG_SOURCE, "Failed to {}. Unknown exception occurred.",
        fuction_name);
    response.error = cfd::js::api::ConvertCfdExceptionToStruct(CfdException());
  }
  return response;
}